

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zueci.c
# Opt level: O3

int zueci_gbk_u(uchar *src,zueci_u32 len,uint flags,zueci_u32 *p_u)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  
  bVar1 = *src;
  iVar4 = 1;
  uVar8 = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    if ((((1 < len) && (uVar8 != 0x80)) && (uVar8 != 0xff)) &&
       (bVar2 = src[1], 0x40 < (byte)(bVar2 + 1) && bVar2 != 0x7f)) {
      if ((byte)(bVar1 + 0x5f) < 9) {
        if (0xa0 < bVar2) {
          iVar4 = 2;
          uVar5 = 0xb7;
          if (bVar2 != 0xa4 || bVar1 != 0xa1) {
            flags = bVar1 ^ 0xa1;
            uVar5 = 0x2014;
            if (bVar2 != 0xaa || (char)flags != '\0') goto LAB_001905d6;
          }
          goto LAB_00190542;
        }
      }
      else if ((byte)(bVar1 + 0x50) < 0x48 && 0xa0 < bVar2) {
LAB_001905d6:
        iVar4 = zueci_gb2312_u(src,len,flags,p_u);
        if (iVar4 != 0) {
          return 2;
        }
      }
      if (((uint)bVar1 * 0x100 + (uint)bVar2) - 0xa1a4 < 0x5cac) {
        uVar5 = (uint)bVar1 * 0x100 | (uint)bVar2;
        iVar4 = 0;
        iVar7 = 0xd0;
        do {
          iVar6 = iVar7 + iVar4 >> 1;
          if (zueci_gbk_nonuro_mb[iVar6] < uVar5) {
            iVar4 = iVar6 + 1;
          }
          else {
            if (zueci_gbk_nonuro_mb[iVar6] <= uVar5) {
              uVar3 = zueci_gbk_nonuro_u[iVar6];
              goto LAB_001906ac;
            }
            iVar7 = iVar6 + -1;
          }
        } while (iVar4 <= iVar7);
      }
      if (bVar1 < 0xa1) {
        iVar7 = -0x5ffe;
        iVar4 = 0xbe;
      }
      else {
        if (0xa0 < bVar2 || bVar1 < 0xa8) goto LAB_00190577;
        iVar7 = -0x2780;
        iVar4 = 0x60;
      }
      iVar4 = iVar4 * uVar8 + iVar7 + (uint)bVar2 + (int)((char)bVar2 >> 7);
      if (iVar4 < 0x3810) {
        uVar3 = zueci_gbk_mb_u[iVar4];
        if (uVar3 == 0) {
          return 0;
        }
LAB_001906ac:
        uVar5 = (uint)uVar3;
        iVar4 = 2;
        goto LAB_00190542;
      }
    }
LAB_00190577:
    iVar4 = 0;
  }
  else {
    uVar5 = (uint)bVar1;
LAB_00190542:
    *p_u = uVar5;
  }
  return iVar4;
}

Assistant:

static int zueci_gbk_u(const unsigned char *src, const zueci_u32 len, const unsigned int flags, zueci_u32 *p_u) {
    unsigned char c1, c2;
    int ind;
    zueci_u32 u2;
    zueci_u16 mb;

    (void)flags;
    assert(len);

    c1 = src[0];
    if (c1 < 0x80) {
        *p_u = c1;
        return 1;
    }
    if (len < 2 || c1 < 0x81 || c1 == 0xFF) {
        return 0;
    }
    c2 = src[1];
    if (c2 < 0x40 || c2 == 0x7F || c2 == 0xFF) {
        return 0;
    }

    /* Try GB 2312 first */
    if (((c1 >= 0xA1 && c1 <= 0xA9) || (c1 >= 0xB0 && c1 <= 0xF7)) && c2 >= 0xA1) {
        if (c1 == 0xA1 && c2 == 0xA4) {
            *p_u = 0x00B7; /* MIDDLE DOT */
            return 2;
        }
        if (c1 == 0xA1 && c2 == 0xAA) {
            *p_u = 0x2014; /* EM DASH */
            return 2;
        }
        if (zueci_gb2312_u(src, len, 0 /*flags*/, p_u)) {
            return 2;
        }
    }

    /* Non-URO? */
    mb = ((zueci_u16) c1 << 8) | c2;
    if (mb >= zueci_gbk_nonuro_mb[0] && mb <= zueci_gbk_nonuro_mb[ZUECI_ASIZE(zueci_gbk_nonuro_mb) - 1]) {
        int s = 0;
        int e = ZUECI_ASIZE(zueci_gbk_nonuro_mb) - 1;
        while (s <= e) {
            const int m = (s + e) >> 1;
            if (zueci_gbk_nonuro_mb[m] < mb) {
                s = m + 1;
            } else if (zueci_gbk_nonuro_mb[m] > mb) {
                e = m - 1;
            } else {
                *p_u = zueci_gbk_nonuro_u[m];
                return 2;
            }
        }
    }

    if (c1 >= 0xA1 && (c1 <= 0xA7 || (c1 >= 0xA8 && c2 >= 0xA1))) {
        return 0;
    }
    if (c1 >= 0xA8) {
        ind = (0xFF - 0x40 - 1) * (0xA1 - 0x81) + (0xA1 - 0x40 - 1) * (c1 - 0xA8) + c2 - 0x40 - (c2 > 0x7F);
    } else {
        ind = (0xFF - 0x40 - 1) * (c1 - 0x81) + c2 - 0x40 - (c2 > 0x7F);
    }
    if (ind < ZUECI_ASIZE(zueci_gbk_mb_u) && (u2 = zueci_gbk_mb_u[ind])) {
        *p_u = u2;
        return 2;
    }
    return 0;
}